

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestMembraneImpl::callPassThrough
          (TestMembraneImpl *this,CallPassThroughContext context)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  CapTableReader *pCVar4;
  RequestHook *pRVar5;
  void *pvVar6;
  WirePointer *__n;
  PromiseArena *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int in_R8D;
  TransformPromiseNodeBase *this_00;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  req;
  Reader params;
  undefined1 local_100 [56];
  SegmentReader *local_c8;
  CapTableReader *pCStack_c0;
  Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_b8;
  StructReader local_80;
  undefined1 local_50 [16];
  Maybe<capnp::MessageSize> local_40;
  
  (*(code *)**(undefined8 **)in_RDX->bytes)(local_100);
  local_b8.super_Builder._builder.data = (void *)local_100._16_8_;
  local_b8.super_Builder._builder.pointers = (WirePointer *)local_100._24_8_;
  local_b8.super_Builder._builder.segment = (SegmentBuilder *)local_100._0_8_;
  local_b8.super_Builder._builder.capTable = (CapTableBuilder *)local_100._8_8_;
  PointerReader::getStruct(&local_80,(PointerReader *)&local_b8,(word *)0x0);
  __n = local_80.pointers;
  if (local_80.pointerCount == 0) {
    local_80.nestingLimit = 0x7fffffff;
    local_80.segment = (SegmentReader *)0x0;
    __n = (WirePointer *)0x0;
    local_80.capTable = (CapTableReader *)0x0;
  }
  local_100._24_4_ = local_80.nestingLimit;
  local_100._0_8_ = local_80.segment;
  local_100._8_8_ = local_80.capTable;
  local_100._16_8_ = __n;
  PointerReader::getCapability((PointerReader *)local_50);
  local_c8 = (SegmentReader *)local_50._0_8_;
  pCStack_c0 = (CapTableReader *)local_50._8_8_;
  local_100._48_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Thing::Client::passThroughRequest
            (&local_b8,(Client *)(local_100 + 0x30),&local_40);
  pCVar4 = pCStack_c0;
  pvVar6 = extraout_RDX;
  if (pCStack_c0 != (CapTableReader *)0x0) {
    pCStack_c0 = (CapTableReader *)0x0;
    (*(code *)local_c8->arena->_vptr_Arena)
              (local_c8,pCVar4->_vptr_CapTableReader[-2] + (long)&pCVar4->_vptr_CapTableReader);
    pvVar6 = extraout_RDX_00;
  }
  if ((local_80.dataSize == 0) || ((*local_80.data & 1) == 0)) {
    Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
    ::send((Request<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
            *)local_100,(int)&local_b8,pvVar6,(size_t)__n,in_R8D);
    uVar2 = local_100._0_8_;
    pPVar1 = *(PromiseArena **)&((SegmentReader *)local_100._0_8_)->id;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_100._0_8_ - (long)pPVar1) < 0x28) {
      pvVar6 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_100,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:68:11)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_006e2720;
      *(PromiseArena **)((long)pvVar6 + 0x3f8) = in_RDX;
      *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
    }
    else {
      *(PromiseArena **)&((SegmentReader *)local_100._0_8_)->id = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)(local_100._0_8_ + -0x30))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_100,
                 kj::_::
                 SimpleTransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMembrane::Result>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:68:11)>
                 ::anon_class_8_1_bc11688f_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_006e2720;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = in_RDX;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    uVar3 = local_100._32_8_;
    uVar2 = local_100._24_8_;
    (this->super_Server)._vptr_Server = (_func_int **)this_00;
    if ((WirePointer *)local_100._24_8_ != (WirePointer *)0x0) {
      local_100._24_8_ = (WirePointer *)0x0;
      local_100._32_4_ = 0;
      local_100._36_2_ = 0;
      local_100._38_2_ = 0;
      (***(_func_int ***)local_100._40_8_)(local_100._40_8_,uVar2,8,uVar3,uVar3,0);
    }
    uVar2 = local_100._16_8_;
    if ((WirePointer *)local_100._16_8_ != (WirePointer *)0x0) {
      local_100._16_8_ = (WirePointer *)0x0;
      (***(_func_int ***)local_100._8_8_)
                (local_100._8_8_,
                 (long)&((WireValue<uint32_t>_conflict *)uVar2)->value +
                 *(long *)((long)*(WirePointer *)uVar2 + -0x10));
    }
    uVar2 = local_100._0_8_;
    if ((SegmentBuilder *)local_100._0_8_ != (SegmentBuilder *)0x0) {
      local_100._0_8_ = (SegmentBuilder *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
  }
  else {
    (**(code **)(*(long *)in_RDX->bytes + 0x18))(this);
  }
  pRVar5 = local_b8.hook.ptr;
  if (local_b8.hook.ptr != (RequestHook *)0x0) {
    local_b8.hook.ptr = (RequestHook *)0x0;
    (**(local_b8.hook.disposer)->_vptr_Disposer)
              (local_b8.hook.disposer,
               (_func_int *)((long)&pRVar5->_vptr_RequestHook + (long)pRVar5->_vptr_RequestHook[-2])
              );
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callPassThrough(CallPassThroughContext context) override {
    auto params = context.getParams();
    auto req = params.getThing().passThroughRequest();
    if (params.getTailCall()) {
      return context.tailCall(kj::mv(req));
    } else {
      return req.send().then(
          [KJ_CPCAP(context)](Response<test::TestMembrane::Result>&& result) mutable {
        context.setResults(result);
      });
    }